

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsEval.c
# Opt level: O2

void UnaryExpression_typeof_eval(JsAstNode *na,JsContext *context,JsValue *res)

{
  char *pcVar1;
  undefined1 local_48 [8];
  JsValue r4;
  JsValue r1;
  
  (*JsNodeClassEval[(*(JsAstNode **)(na + 1))->astClass])
            (*(JsAstNode **)(na + 1),context,(JsValue *)((long)&r4.u + 8));
  res->type = JS_STRING;
  if ((r4.u.completion.type == (JS_COMPLETION_THROW|JS_COMPLETION_CONTINUE)) && (r1._0_8_ == 0)) {
    pcVar1 = "undefined";
  }
  else {
    JsGetValue((JsValue *)((long)&r4.u + 8),(JsValue *)local_48);
    if ((ulong)(uint)local_48._0_4_ < 6) {
      pcVar1 = &DAT_00113190 + *(int *)(&DAT_00113190 + (ulong)(uint)local_48._0_4_ * 4);
    }
    else {
      pcVar1 = "unknow";
    }
  }
  (res->u).number = (double)pcVar1;
  return;
}

Assistant:

static void
UnaryExpression_typeof_eval(na, context, res)
	struct JsAstNode *na; /* (struct JsAstUnaryNode) */
	struct JsContext *context;
	struct JsValue *res;
{
	struct JsAstUnaryNode *n = CAST_NODE(na, JsAstUnaryNode);
	struct JsValue r1;

	EVAL(n->a, context, &r1);
	UnaryExpression_typeof_eval_common(context, &r1, res);
}